

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall FSingleLumpFont::CheckFON1Chars(FSingleLumpFont *this,double *luminosity)

{
  FFontChar2 *this_00;
  CharData *pCVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  LumpRecord *pLVar7;
  int width;
  FResourceLump **ppFVar8;
  byte bVar9;
  uint uVar10;
  FResourceLump **ppFVar11;
  int iVar12;
  FMemLump memLump;
  BYTE used [256];
  undefined1 local_250 [16];
  LumpRecord *local_240;
  char local_238 [256];
  byte abStack_138 [264];
  
  local_250._8_8_ = luminosity;
  FWadCollection::ReadLump((FWadCollection *)local_250,0x1c70340);
  pLVar7 = (LumpRecord *)0x0;
  local_240 = (LumpRecord *)local_250._0_8_;
  if (*(int *)(local_250._0_8_ + -0xc) == 0) {
    local_240 = pLVar7;
  }
  memset(local_238,0,0x100);
  ppFVar8 = (FResourceLump **)((long)local_240 + 8);
  pCVar1 = (this->super_FFont).Chars;
  width = (this->super_FFont).SpaceWidth;
  do {
    iVar12 = (this->super_FFont).FontHeight;
    iVar2 = width;
    if (pCVar1[(long)pLVar7].Pic == (FTexture *)0x0) {
      this_00 = (FFontChar2 *)operator_new(0x78);
      FFontChar2::FFontChar2
                (this_00,(this->super_FFont).Lump,(int)ppFVar8 - (int)local_240,width,iVar12,0,0);
      pCVar1 = (this->super_FFont).Chars;
      pCVar1[(long)pLVar7].Pic = (FTexture *)this_00;
      iVar2 = (this->super_FFont).SpaceWidth;
      pCVar1[(long)pLVar7].XMove = iVar2;
    }
    iVar12 = iVar12 * width;
    ppFVar11 = ppFVar8;
    do {
      ppFVar8 = (FResourceLump **)((long)ppFVar11 + 1);
      uVar4 = (uint)(char)*(byte *)ppFVar11;
      if ((char)*(byte *)ppFVar11 < '\0') {
        ppFVar8 = (FResourceLump **)((long)ppFVar11 + 2);
        local_238[*(byte *)((long)ppFVar11 + 1)] = '\x01';
        iVar12 = iVar12 + uVar4 + -1;
      }
      else {
        uVar10 = uVar4 + 1;
        do {
          bVar9 = *(byte *)ppFVar8;
          ppFVar8 = (FResourceLump **)((long)ppFVar8 + 1);
          local_238[bVar9] = '\x01';
          bVar9 = (char)uVar10 - 1;
          uVar10 = (uint)bVar9;
        } while (bVar9 != 0);
        iVar12 = iVar12 + ~uVar4;
      }
      ppFVar11 = ppFVar8;
    } while (0 < iVar12);
    pLVar7 = (LumpRecord *)((long)&pLVar7->wadnum + 1);
    width = iVar2;
  } while (pLVar7 != (LumpRecord *)0x100);
  memset((this->super_FFont).PatchRemap,0,0x100);
  uVar4 = 1;
  lVar3 = 1;
  do {
    if (local_238[lVar3] != '\0') {
      lVar5 = (long)(int)uVar4;
      uVar4 = uVar4 + 1;
      abStack_138[lVar5] = (byte)lVar3;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  if (1 < (int)uVar4) {
    uVar6 = 1;
    do {
      bVar9 = abStack_138[uVar6];
      (this->super_FFont).PatchRemap[bVar9] = (BYTE)uVar6;
      *(double *)(local_250._8_8_ + uVar6 * 8) = (double)(int)(bVar9 - 1) / 254.0;
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  (this->super_FFont).ActiveColors = uVar4;
  FMemLump::~FMemLump((FMemLump *)local_250);
  return;
}

Assistant:

void FSingleLumpFont::CheckFON1Chars (double *luminosity)
{
	FMemLump memLump = Wads.ReadLump(Lump);
	const BYTE* data = (const BYTE*) memLump.GetMem();

	BYTE used[256], reverse[256];
	const BYTE *data_p;
	int i, j;

	memset (used, 0, 256);
	data_p = data + 8;

	for (i = 0; i < 256; ++i)
	{
		int destSize = SpaceWidth * FontHeight;

		if(!Chars[i].Pic)
		{
			Chars[i].Pic = new FFontChar2 (Lump, int(data_p - data), SpaceWidth, FontHeight);
			Chars[i].XMove = SpaceWidth;
		}

		// Advance to next char's data and count the used colors.
		do
		{
			SBYTE code = *data_p++;
			if (code >= 0)
			{
				destSize -= code+1;
				while (code-- >= 0)
				{
					used[*data_p++] = 1;
				}
			}
			else if (code != -128)
			{
				used[*data_p++] = 1;
				destSize -= 1 - code;
			}
		} while (destSize > 0);
	}

	memset (PatchRemap, 0, 256);
	reverse[0] = 0;
	for (i = 1, j = 1; i < 256; ++i)
	{
		if (used[i])
		{
			reverse[j++] = i;
		}
	}
	for (i = 1; i < j; ++i)
	{
		PatchRemap[reverse[i]] = i;
		luminosity[i] = (reverse[i] - 1) / 254.0;
	}
	ActiveColors = j;
}